

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O0

int memleak_cmp(avl_node *a,avl_node *b,void *aux)

{
  memleak_item *bb;
  memleak_item *aa;
  void *aux_local;
  avl_node *b_local;
  avl_node *a_local;
  int local_4;
  
  if (a[-2].right < b[-2].right) {
    local_4 = -1;
  }
  else if (b[-2].right < a[-2].right) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int memleak_cmp(struct avl_node *a, struct avl_node *b, void *aux)
{
    struct memleak_item *aa, *bb;
    aa = _get_entry(a, struct memleak_item, avl);
    bb = _get_entry(b, struct memleak_item, avl);
    if (aa->addr < bb->addr) return -1;
    else if (aa->addr > bb->addr) return 1;
    else return 0;
}